

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O3

void sorting::rgb(vector<Palette,_std::allocator<Palette>_> *palettes)

{
  Palette *pPVar1;
  long lVar2;
  iterator pvVar3;
  iterator pvVar4;
  ulong uVar5;
  Palette *pal;
  Palette *this;
  unsigned_short *__i;
  iterator pvVar6;
  
  Options::verbosePrint(&options,'\x02',"Sorting palettes by \"\"\"luminance\"\"\"...\n");
  pPVar1 = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pPVar1; this = this + 1) {
    pvVar3 = Palette::begin(this);
    pvVar4 = Palette::end(this);
    if (pvVar3 != pvVar4) {
      uVar5 = (long)pvVar4 - (long)pvVar3 >> 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_comp_iter<sorting::rgb(std::vector<Palette,std::allocator<Palette>>&)::__0>>
                (pvVar3,pvVar4,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pvVar4 - (long)pvVar3 < 0x21) {
        std::
        __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::rgb(std::vector<Palette,std::allocator<Palette>>&)::__0>>
                  (pvVar3,pvVar4);
      }
      else {
        pvVar6 = pvVar3 + 0x10;
        std::
        __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::rgb(std::vector<Palette,std::allocator<Palette>>&)::__0>>
                  (pvVar3,pvVar6);
        for (; pvVar6 != pvVar4; pvVar6 = pvVar6 + 1) {
          std::
          __unguarded_linear_insert<unsigned_short*,__gnu_cxx::__ops::_Val_comp_iter<sorting::rgb(std::vector<Palette,std::allocator<Palette>>&)::__0>>
                    (pvVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void rgb(std::vector<Palette> &palettes) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting palettes by \"\"\"luminance\"\"\"...\n");

	for (Palette &pal : palettes) {
		std::sort(pal.begin(), pal.end(), [](uint16_t lhs, uint16_t rhs) {
			return legacyLuminance(lhs) > legacyLuminance(rhs);
		});
	}
}